

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.cpp
# Opt level: O3

void __thiscall btSliderConstraint::testAngLimits(btSliderConstraint *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  btScalar bVar4;
  
  this->m_angDepth = 0.0;
  this->m_solveAngLim = false;
  if (this->m_lowerAngLimit <= this->m_upperAngLimit) {
    fVar3 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[1];
    fVar1 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[1];
    fVar2 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[1];
    fVar3 = atan2f((this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2] * fVar2 +
                   (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[2] * fVar3 +
                   (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2] * fVar1,
                   fVar2 * (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1] +
                   fVar3 * (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[1] +
                   fVar1 * (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1]);
    bVar4 = btAdjustAngleToLimits(fVar3,this->m_lowerAngLimit,this->m_upperAngLimit);
    this->m_angPos = bVar4;
    fVar3 = this->m_lowerAngLimit;
    if ((bVar4 < fVar3) || (fVar3 = this->m_upperAngLimit, fVar3 < bVar4)) {
      this->m_angDepth = bVar4 - fVar3;
      this->m_solveAngLim = true;
    }
  }
  return;
}

Assistant:

void btSliderConstraint::testAngLimits(void)
{
	m_angDepth = btScalar(0.);
	m_solveAngLim = false;
	if(m_lowerAngLimit <= m_upperAngLimit)
	{
		const btVector3 axisA0 = m_calculatedTransformA.getBasis().getColumn(1);
		const btVector3 axisA1 = m_calculatedTransformA.getBasis().getColumn(2);
		const btVector3 axisB0 = m_calculatedTransformB.getBasis().getColumn(1);
//		btScalar rot = btAtan2Fast(axisB0.dot(axisA1), axisB0.dot(axisA0));  
		btScalar rot = btAtan2(axisB0.dot(axisA1), axisB0.dot(axisA0));  
		rot = btAdjustAngleToLimits(rot, m_lowerAngLimit, m_upperAngLimit);
		m_angPos = rot;
		if(rot < m_lowerAngLimit)
		{
			m_angDepth = rot - m_lowerAngLimit;
			m_solveAngLim = true;
		} 
		else if(rot > m_upperAngLimit)
		{
			m_angDepth = rot - m_upperAngLimit;
			m_solveAngLim = true;
		}
	}
}